

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O0

void Joy_GenerateButtonEvents(int oldbuttons,int newbuttons,int numbuttons,int base)

{
  int local_34;
  uint local_30;
  int j;
  int mask;
  event_t ev;
  int changed;
  int base_local;
  int numbuttons_local;
  int newbuttons_local;
  int oldbuttons_local;
  
  ev.x = oldbuttons ^ newbuttons;
  if (ev.x != 0) {
    ev.y = base;
    memset(&j,0,0x10);
    local_30 = 1;
    for (local_34 = 0; local_34 < numbuttons; local_34 = local_34 + 1) {
      if ((ev.x & local_30) != 0) {
        j._2_2_ = (short)ev.y + (short)local_34;
        j._0_1_ = 2;
        if ((newbuttons & local_30) != 0) {
          j._0_1_ = 1;
        }
        D_PostEvent((event_t *)&j);
      }
      local_30 = local_30 << 1;
    }
  }
  return;
}

Assistant:

void Joy_GenerateButtonEvents(int oldbuttons, int newbuttons, int numbuttons, int base)
{
	int changed = oldbuttons ^ newbuttons;
	if (changed != 0)
	{
		event_t ev = { 0, 0, 0, 0, 0, 0, 0 };
		int mask = 1;
		for (int j = 0; j < numbuttons; mask <<= 1, ++j)
		{
			if (changed & mask)
			{
				ev.data1 = base + j;
				ev.type = (newbuttons & mask) ? EV_KeyDown : EV_KeyUp;
				D_PostEvent(&ev);
			}
		}
	}
}